

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_INT ref_histogram_to_bin(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  double dVar1;
  double dVar2;
  int local_38;
  int local_34;
  REF_INT ibin;
  REF_DBL dbin;
  REF_DBL observation_local;
  REF_HISTOGRAM ref_histogram_local;
  
  dVar1 = ref_histogram->exp;
  dVar2 = log2(observation);
  local_34 = (int)((double)(ref_histogram->nbin / 2) + dVar1 * dVar2);
  if (local_34 < 0) {
    local_34 = 0;
  }
  if (ref_histogram->nbin + -1 < local_34) {
    local_38 = ref_histogram->nbin + -1;
  }
  else {
    local_38 = local_34;
  }
  return local_38;
}

Assistant:

REF_INT ref_histogram_to_bin(REF_HISTOGRAM ref_histogram, REF_DBL observation) {
  REF_DBL dbin;
  REF_INT ibin;
  dbin = ref_histogram_exp(ref_histogram) * log2((observation));
  dbin += ref_histogram_nbin(ref_histogram) / 2;
  ibin = (REF_INT)dbin;
  ibin = MAX(0, ibin);
  ibin = MIN(ref_histogram_nbin(ref_histogram) - 1, ibin);
  return ibin;
}